

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.hpp
# Opt level: O1

maybe<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_void>
* __thiscall
pstore::
from_base64<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (maybe<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_void>
           *__return_storage_ptr__,pstore *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                last,
          back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> out)

{
  pstore pVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  array<unsigned_char,_4UL> buff;
  array<unsigned_char,_4UL> local_34;
  
  uVar5 = 0;
  uVar4 = 0;
  if (this != (pstore *)first._M_current) {
    do {
      pVar1 = *this;
      bVar3 = (char)pVar1 + 0xbf;
      if (bVar3 < 0x1a) {
LAB_00137eda:
        uVar4 = (int)uVar5 + 1;
        local_34._M_elems[uVar5] = bVar3;
        uVar5 = (ulong)uVar4;
        bVar2 = false;
        if (3 < uVar4) {
          last._M_current =
               (char *)details::
                       decode4<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                 (&local_34,last._M_current,3);
          uVar5 = 0;
          bVar2 = false;
        }
      }
      else {
        if ((byte)((char)pVar1 + 0x9fU) < 0x1a) {
          bVar3 = (char)pVar1 + 0xb9;
          goto LAB_00137eda;
        }
        if ((byte)((char)pVar1 - 0x30U) < 10) {
          bVar3 = (char)pVar1 + 4;
          goto LAB_00137eda;
        }
        if (pVar1 == (pstore)0x2b) {
          bVar3 = 0x3e;
          goto LAB_00137eda;
        }
        if (pVar1 == (pstore)0x3d) {
          bVar2 = false;
        }
        else {
          if (pVar1 == (pstore)0x2f) {
            bVar3 = 0x3f;
            goto LAB_00137eda;
          }
          bVar2 = true;
        }
      }
      uVar4 = (uint)uVar5;
    } while ((!bVar2) && (this = this + 1, this != (pstore *)first._M_current));
  }
  if (uVar4 != 0) {
    if (uVar4 != 4) {
      memset(local_34._M_elems + uVar4,0,4 - (ulong)uVar4);
    }
    last._M_current =
         (char *)details::
                 decode4<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           (&local_34,last._M_current,uVar4 - 1);
  }
  if (this == (pstore *)first._M_current) {
    __return_storage_ptr__->valid_ = true;
    (__return_storage_ptr__->storage_).__align =
         (anon_struct_8_0_00000001_for___align)last._M_current;
  }
  else {
    *(undefined8 *)__return_storage_ptr__ = 0;
    __return_storage_ptr__->storage_ = (type)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

maybe<OutputIterator> from_base64 (InputIterator first, InputIterator last,
                                       OutputIterator out) {
        auto count = 0U;
        std::array<std::uint8_t, 4> buff;

        for (; first != last; ++first) {
            auto c = *first;
            if (c >= 'A' && c <= 'Z') {
                c = c - 'A';
            } else if (c >= 'a' && c <= 'z') {
                c = c - 'a' + 26;
            } else if (c >= '0' && c <= '9') {
                c = c - '0' + 26 * 2;
            } else if (c == '+') {
                c = 0x3E;
            } else if (c == '/') {
                c = 0x3F;
            } else if (c == '=') {
                continue;
            } else {
                break; // error.
            }
            buff[count++] = static_cast<std::uint8_t> (c);
            if (count >= 4U) {
                out = details::decode4 (buff, out, 3);
                count = 0U;
            }
        }
        if (count > 0) {
            std::fill (buff.begin () + count, buff.end (), std::uint8_t{0});
            out = details::decode4 (buff, out, count - 1);
        }
        return first == last ? just (out) : nothing<OutputIterator> ();
    }